

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
getLocalOptionValues
          (HighsLogOptions *report_log_options,string *option,
          vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
          double *current_value,double *min_value,double *max_value,double *default_value)

{
  value_type pOVar1;
  const_reference ppOVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *in_RCX;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RDX;
  HighsLogOptions *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  size_type *in_stack_00000008;
  OptionRecordDouble *option_record;
  HighsOptionType type;
  OptionStatus status;
  HighsInt index;
  HighsInt *in_stack_ffffffffffffff70;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  HighsLogOptions *in_stack_ffffffffffffff88;
  string local_68 [20];
  HighsOptionType in_stack_ffffffffffffffac;
  int local_3c;
  OptionStatus local_4;
  
  local_4 = getOptionIndex(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if (local_4 == kOk) {
    ppOVar2 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        (in_RDX,(long)local_3c);
    if ((*ppOVar2)->type == kDouble) {
      ppOVar2 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          (in_RDX,(long)local_3c);
      pOVar1 = *ppOVar2;
      if (in_RCX != (undefined8 *)0x0) {
        *in_RCX = *pOVar1[1]._vptr_OptionRecord;
      }
      if (in_R8 != (undefined8 *)0x0) {
        *in_R8 = *(undefined8 *)&pOVar1[1].type;
      }
      if (in_R9 != (undefined8 *)0x0) {
        *in_R9 = *(undefined8 *)&pOVar1[1].name;
      }
      if (in_stack_00000008 != (size_type *)0x0) {
        *in_stack_00000008 = pOVar1[1].name._M_string_length;
      }
      local_4 = kOk;
    }
    else {
      uVar3 = std::__cxx11::string::c_str();
      optionEntryTypeToString_abi_cxx11_(in_stack_ffffffffffffffac);
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDI,kError,
                   "getLocalOptionValue: Option \"%s\" requires value of type %s, not double\n",
                   uVar3,uVar4);
      std::__cxx11::string::~string(local_68);
      local_4 = kIllegalValue;
    }
  }
  return local_4;
}

Assistant:

OptionStatus getLocalOptionValues(
    const HighsLogOptions& report_log_options, const std::string& option,
    const std::vector<OptionRecord*>& option_records, double* current_value,
    double* min_value, double* max_value, double* default_value) {
  HighsInt index;
  OptionStatus status =
      getOptionIndex(report_log_options, option, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kDouble) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "getLocalOptionValue: Option \"%s\" requires value of type "
                 "%s, not double\n",
                 option.c_str(), optionEntryTypeToString(type).c_str());
    return OptionStatus::kIllegalValue;
  }
  OptionRecordDouble& option_record =
      ((OptionRecordDouble*)option_records[index])[0];
  if (current_value) *current_value = *(option_record.value);
  if (min_value) *min_value = option_record.lower_bound;
  if (max_value) *max_value = option_record.upper_bound;
  if (default_value) *default_value = option_record.default_value;
  return OptionStatus::kOk;
}